

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::session_impl::incoming_connection(session_impl *this,socket_type *s)

{
  torrent_handle *this_00;
  long lVar1;
  bool bVar2;
  bool bVar3;
  socket_type_t st;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  add_pointer_t<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>
  ptVar9;
  undefined8 uVar10;
  int64_t iVar11;
  element_type *this_01;
  reference this_02;
  peer_class *ppVar12;
  iterator iVar13;
  iterator iVar14;
  element_type *peVar15;
  size_type sVar16;
  size_type sVar17;
  int __type;
  error_code *ec_00;
  error_code *ec_01;
  error_code *ec_02;
  undefined1 local_550 [16];
  undefined1 local_540 [8];
  shared_ptr<libtorrent::aux::peer_connection> c;
  peer_connection_args pack;
  close_reason_t local_322;
  undefined1 local_320 [5];
  bool has_active_torrent;
  socket_type_t local_30e;
  operation_t local_30d;
  digest32<160L> local_30c;
  torrent_handle local_2f8;
  undefined1 local_2e1;
  long lStack_2e0;
  bool reject;
  int64_t limit;
  uint local_2d0;
  int f;
  int local_2c8;
  peer_class_t pc;
  int i;
  int connection_limit_factor;
  undefined1 local_2a0 [8];
  peer_class_set pcs;
  undefined1 auStack_258 [3];
  bool want_on_unknown_torrent;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_250;
  address local_240;
  address local_220;
  reason_t local_1fc;
  torrent_handle local_1f8;
  address local_1e0;
  string local_1c0;
  string local_1a0;
  address local_180;
  reason_t local_15c;
  torrent_handle local_158;
  address local_148;
  string local_128;
  address local_108;
  string local_e8;
  undefined1 local_c8 [8];
  endpoint local;
  reason_t local_7c;
  torrent_handle local_78;
  string local_68;
  undefined1 local_44 [8];
  endpoint endp;
  error_code ec;
  socket_type *s_local;
  session_impl *this_local;
  
  if ((this->m_abort & 1U) == 0) {
    if ((this->m_paused & 1U) == 0) {
      boost::system::error_code::error_code
                ((error_code *)((long)&endp.impl_.data_.v6.sin6_addr.__in6_u + 0xc));
      polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
      ::remote_endpoint((endpoint_type *)local_44,s,
                        (error_code *)((long)&endp.impl_.data_.v6.sin6_addr.__in6_u + 0xc));
      bVar2 = boost::system::error_code::operator_cast_to_bool
                        ((error_code *)((long)&endp.impl_.data_.v6.sin6_addr.__in6_u + 0xc));
      if (bVar2) {
        bVar2 = should_log(this);
        if (bVar2) {
          print_error_abi_cxx11_
                    (&local_68,
                     (libtorrent *)(endp.impl_.data_.v6.sin6_addr.__in6_u.__u6_addr8 + 0xc),ec_00);
          uVar10 = ::std::__cxx11::string::c_str();
          session_log(this,
                      " <== INCOMING CONNECTION [ rejected, could not retrieve remote endpoint: %s ]"
                      ,uVar10);
          ::std::__cxx11::string::~string((string *)&local_68);
        }
      }
      else {
        bVar2 = session_settings::get_bool(&this->m_settings,0x8021);
        if ((bVar2) || (bVar2 = is_utp(s), !bVar2)) {
          bVar2 = session_settings::get_bool(&this->m_settings,0x8023);
          if ((bVar2) ||
             (ptVar9 = ::std::
                       get_if<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,b___::ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>
                                 (&s->
                                   super_variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                                 ),
             ptVar9 == (add_pointer_t<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>
                        )0x0)) {
            bVar2 = ::std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::empty(&this->m_outgoing_interfaces);
            if (!bVar2) {
              polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
              ::local_endpoint((endpoint_type *)local_c8,s,
                               (error_code *)((long)&endp.impl_.data_.v6.sin6_addr.__in6_u + 0xc));
              bVar2 = boost::system::error_code::operator_cast_to_bool
                                ((error_code *)((long)&endp.impl_.data_.v6.sin6_addr.__in6_u + 0xc))
              ;
              if (bVar2) {
                bVar2 = should_log(this);
                if (!bVar2) {
                  return;
                }
                print_error_abi_cxx11_
                          (&local_e8,
                           (libtorrent *)(endp.impl_.data_.v6.sin6_addr.__in6_u.__u6_addr8 + 0xc),
                           ec_01);
                uVar10 = ::std::__cxx11::string::c_str();
                session_log(this,"<== INCOMING CONNECTION [ rejected connection: %s ]",uVar10);
                ::std::__cxx11::string::~string((string *)&local_e8);
                return;
              }
              boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                        (&local_108,(basic_endpoint<boost::asio::ip::tcp> *)local_c8);
              bVar2 = verify_incoming_interface(this,&local_108);
              if (((bVar2 ^ 0xffU) & 1) != 0) {
                bVar2 = should_log(this);
                if (bVar2) {
                  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                            (&local_148,(basic_endpoint<boost::asio::ip::tcp> *)local_c8);
                  boost::asio::ip::address::to_string_abi_cxx11_(&local_128,&local_148);
                  uVar10 = ::std::__cxx11::string::c_str();
                  session_log(this,
                              "<== INCOMING CONNECTION [ rejected, local interface has incoming connections disabled: %s ]"
                              ,uVar10);
                  ::std::__cxx11::string::~string((string *)&local_128);
                }
                bVar2 = alert_manager::should_post<libtorrent::peer_blocked_alert>(&this->m_alerts);
                if (!bVar2) {
                  return;
                }
                local_158.m_torrent.
                super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                local_158.m_torrent.
                super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                torrent_handle::torrent_handle(&local_158);
                local_15c = invalid_local_interface;
                alert_manager::
                emplace_alert<libtorrent::peer_blocked_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::peer_blocked_alert::reason_t>
                          (&this->m_alerts,&local_158,
                           (basic_endpoint<boost::asio::ip::tcp> *)local_44,&local_15c);
                torrent_handle::~torrent_handle(&local_158);
                return;
              }
              boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                        (&local_180,(basic_endpoint<boost::asio::ip::tcp> *)local_c8);
              bVar2 = is_utp(s);
              bVar2 = verify_bound_address
                                (this,&local_180,bVar2,
                                 (error_code *)((long)&endp.impl_.data_.v6.sin6_addr.__in6_u + 0xc))
              ;
              if (((bVar2 ^ 0xffU) & 1) != 0) {
                bVar2 = boost::system::error_code::operator_cast_to_bool
                                  ((error_code *)
                                   ((long)&endp.impl_.data_.v6.sin6_addr.__in6_u + 0xc));
                if (bVar2) {
                  bVar2 = should_log(this);
                  if (!bVar2) {
                    return;
                  }
                  print_error_abi_cxx11_
                            (&local_1a0,
                             (libtorrent *)(endp.impl_.data_.v6.sin6_addr.__in6_u.__u6_addr8 + 0xc),
                             ec_02);
                  uVar10 = ::std::__cxx11::string::c_str();
                  session_log(this,
                              "<== INCOMING CONNECTION [ rejected, not allowed local interface: %s ]"
                              ,uVar10);
                  ::std::__cxx11::string::~string((string *)&local_1a0);
                  return;
                }
                bVar2 = should_log(this);
                if (bVar2) {
                  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                            (&local_1e0,(basic_endpoint<boost::asio::ip::tcp> *)local_c8);
                  boost::asio::ip::address::to_string_abi_cxx11_(&local_1c0,&local_1e0);
                  uVar10 = ::std::__cxx11::string::c_str();
                  session_log(this,
                              "<== INCOMING CONNECTION [ rejected, not allowed local interface: %s ]"
                              ,uVar10);
                  ::std::__cxx11::string::~string((string *)&local_1c0);
                }
                bVar2 = alert_manager::should_post<libtorrent::peer_blocked_alert>(&this->m_alerts);
                if (!bVar2) {
                  return;
                }
                local_1f8.m_torrent.
                super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                local_1f8.m_torrent.
                super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                torrent_handle::torrent_handle(&local_1f8);
                local_1fc = invalid_local_interface;
                alert_manager::
                emplace_alert<libtorrent::peer_blocked_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::peer_blocked_alert::reason_t>
                          (&this->m_alerts,&local_1f8,
                           (basic_endpoint<boost::asio::ip::tcp> *)local_44,&local_1fc);
                torrent_handle::~torrent_handle(&local_1f8);
                return;
              }
            }
            boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                      (&local_220,(basic_endpoint<boost::asio::ip::tcp> *)local_44);
            bVar2 = is_local(&local_220);
            if (((bVar2 ^ 0xffU) & 1) != 0) {
              counters::set_value(&this->m_stats_counters,0x116,1);
            }
            iVar11 = counters::operator[](&this->m_stats_counters,0xdb);
            bVar2 = false;
            if (iVar11 == 0) {
              bVar3 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_ip_filter)
              ;
              bVar2 = false;
              if (bVar3) {
                this_01 = ::std::
                          __shared_ptr_access<libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)&this->m_ip_filter);
                boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                          (&local_240,(basic_endpoint<boost::asio::ip::tcp> *)local_44);
                uVar6 = ip_filter::access(this_01,(char *)&local_240,__type);
                bVar2 = (uVar6 & 1) != 0;
              }
            }
            if (bVar2) {
              session_log(this,"<== INCOMING CONNECTION [ filtered blocked ip ]");
              bVar2 = alert_manager::should_post<libtorrent::peer_blocked_alert>(&this->m_alerts);
              if (bVar2) {
                _auStack_258 = (element_type *)0x0;
                _Stack_250._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                torrent_handle::torrent_handle((torrent_handle *)auStack_258);
                pcs.m_class.
                super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
                ._M_elems[0xe].m_val = 0;
                alert_manager::
                emplace_alert<libtorrent::peer_blocked_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::peer_blocked_alert::reason_t>
                          (&this->m_alerts,(torrent_handle *)auStack_258,
                           (basic_endpoint<boost::asio::ip::tcp> *)local_44,
                           &pcs.m_class.
                            super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
                            ._M_elems[0xe].m_val);
                torrent_handle::~torrent_handle((torrent_handle *)auStack_258);
              }
            }
            else {
              pcs.m_class.
              super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
              ._M_elems[0xd].m_val._3_1_ = 0;
              this_02 = ::std::
                        array<std::vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>,_5UL>
                        ::operator[](&this->m_ses_extensions,4);
              bVar2 = ::std::
                      vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
                      ::empty(this_02);
              pcs.m_class.
              super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
              ._M_elems[0xd].m_val._3_1_ = (bVar2 ^ 0xffU) & 1;
              bVar2 = torrent_list<libtorrent::aux::torrent>::empty(&this->m_torrents);
              if ((bVar2) &&
                 ((pcs.m_class.
                   super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
                   ._M_elems[0xd].m_val._3_1_ & 1) == 0)) {
                session_log(this,"<== INCOMING CONNECTION [ rejected, there are no torrents ]");
              }
              else {
                peer_class_set::peer_class_set((peer_class_set *)local_2a0);
                boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                          ((address *)&i,(basic_endpoint<boost::asio::ip::tcp> *)local_44);
                st = socket_type_idx(s);
                set_peer_classes(this,(peer_class_set *)local_2a0,(address *)&i,st);
                pc.m_val = 0;
                for (local_2c8 = 0; iVar5 = local_2c8,
                    iVar4 = peer_class_set::num_classes((peer_class_set *)local_2a0), iVar5 < iVar4;
                    local_2c8 = local_2c8 + 1) {
                  local_2d0 = (uint)peer_class_set::class_at((peer_class_set *)local_2a0,local_2c8);
                  f = local_2d0;
                  ppVar12 = peer_class_pool::at(&this->m_classes,(peer_class_t)local_2d0);
                  if (ppVar12 != (peer_class *)0x0) {
                    limit._0_4_ = f;
                    ppVar12 = peer_class_pool::at(&this->m_classes,(peer_class_t)f);
                    limit._4_4_ = ppVar12->connection_limit_factor;
                    if ((int)pc.m_val < (int)limit._4_4_) {
                      pc.m_val = limit._4_4_;
                    }
                  }
                }
                if (pc.m_val == 0) {
                  pc.m_val = 100;
                }
                iVar5 = session_settings::get_int(&this->m_settings,0x4055);
                lStack_2e0 = ((long)iVar5 * 100) / (long)(int)pc.m_val;
                iVar5 = num_connections(this);
                lVar1 = lStack_2e0;
                iVar4 = session_settings::get_int(&this->m_settings,0x4056);
                local_2e1 = lVar1 + iVar4 <= (long)iVar5;
                if ((bool)local_2e1) {
                  bVar2 = alert_manager::should_post<libtorrent::peer_disconnected_alert>
                                    (&this->m_alerts);
                  if (bVar2) {
                    local_2f8.m_torrent.
                    super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                         (element_type *)0x0;
                    local_2f8.m_torrent.
                    super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    torrent_handle::torrent_handle(&local_2f8);
                    digest32<160L>::digest32(&local_30c);
                    local_30d = bittorrent;
                    local_30e = socket_type_idx(s);
                    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                              ((error_code *)local_320,too_many_connections,(type *)0x0);
                    local_322 = none;
                    alert_manager::
                    emplace_alert<libtorrent::peer_disconnected_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::digest32<160l>,libtorrent::operation_t,libtorrent::socket_type_t,boost::system::error_code,libtorrent::close_reason_t>
                              (&this->m_alerts,&local_2f8,
                               (basic_endpoint<boost::asio::ip::tcp> *)local_44,&local_30c,
                               &local_30d,&local_30e,(error_code *)local_320,&local_322);
                    torrent_handle::~torrent_handle(&local_2f8);
                  }
                  bVar2 = should_log(this);
                  if (bVar2) {
                    uVar6 = num_connections(this);
                    uVar7 = session_settings::get_int(&this->m_settings,0x4055);
                    uVar8 = session_settings::get_int(&this->m_settings,0x4056);
                    session_log(this,
                                "<== INCOMING CONNECTION [ connections limit exceeded, conns: %d, limit: %d, slack: %d ]"
                                ,(ulong)uVar6,(ulong)uVar7,(ulong)uVar8);
                  }
                }
                else {
                  bVar2 = session_settings::get_bool(&this->m_settings,0x801c);
                  if ((!bVar2) &&
                     ((pcs.m_class.
                       super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
                       ._M_elems[0xd].m_val._3_1_ & 1) == 0)) {
                    iVar13 = torrent_list<libtorrent::aux::torrent>::begin(&this->m_torrents);
                    iVar14 = torrent_list<libtorrent::aux::torrent>::end(&this->m_torrents);
                    bVar2 = ::std::
                            any_of<__gnu_cxx::__normal_iterator<std::shared_ptr<libtorrent::aux::torrent>*,std::vector<std::shared_ptr<libtorrent::aux::torrent>,std::allocator<std::shared_ptr<libtorrent::aux::torrent>>>>,libtorrent::aux::session_impl::incoming_connection(libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::___tream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>)::__0>
                                      (iVar13._M_current,iVar14._M_current);
                    if (!bVar2) {
                      session_log(this,"<== INCOMING CONNECTION [ rejected, no active torrents ]");
                      return;
                    }
                  }
                  counters::inc_stats_counter(&this->m_stats_counters,0x38,1);
                  bVar2 = alert_manager::should_post<libtorrent::incoming_connection_alert>
                                    (&this->m_alerts);
                  if (bVar2) {
                    pack._494_1_ = socket_type_idx(s);
                    alert_manager::
                    emplace_alert<libtorrent::incoming_connection_alert,libtorrent::socket_type_t,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&>
                              (&this->m_alerts,&pack.field_0x1ee,
                               (basic_endpoint<boost::asio::ip::tcp> *)local_44);
                  }
                  pack.sett = (session_settings *)&this->m_stats_counters;
                  c.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
                  pack.ses = (session_interface *)&this->m_settings;
                  pack.stats_counters =
                       (counters *)
                       ::std::
                       unique_ptr<libtorrent::disk_interface,_std::default_delete<libtorrent::disk_interface>_>
                       ::get(&this->m_disk_thread);
                  pack.disk_thread = (disk_interface *)this->m_io_context;
                  pack.ios = (io_context *)0x0;
                  pack.tor.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)0x0;
                  ::std::weak_ptr<libtorrent::aux::torrent>::weak_ptr
                            ((weak_ptr<libtorrent::aux::torrent> *)&pack.ios);
                  polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                  ::polymorphic_socket
                            ((polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                              *)&pack.tor.
                                 super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount,s);
                  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
                            ((basic_endpoint<boost::asio::ip::tcp> *)
                             &pack.s.
                              super_variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                              .
                              super__Variant_base<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                              .
                              super__Move_assign_alias<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                              .
                              super__Copy_assign_alias<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                              .
                              super__Move_ctor_alias<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                              .
                              super__Copy_ctor_alias<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                              .
                              super__Variant_storage_alias<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                              ._M_index,(basic_endpoint<boost::asio::ip::tcp> *)local_44);
                  pack._456_8_ = 0;
                  generate_peer_id((peer_id *)&pack.peerinfo,&this->m_settings);
                  ::std::
                  make_shared<libtorrent::aux::bt_peer_connection,libtorrent::aux::peer_connection_args&>
                            ((peer_connection_args *)local_550);
                  ::std::shared_ptr<libtorrent::aux::peer_connection>::
                  shared_ptr<libtorrent::aux::bt_peer_connection,void>
                            ((shared_ptr<libtorrent::aux::peer_connection> *)local_540,
                             (shared_ptr<libtorrent::aux::bt_peer_connection> *)local_550);
                  ::std::shared_ptr<libtorrent::aux::bt_peer_connection>::~shared_ptr
                            ((shared_ptr<libtorrent::aux::bt_peer_connection> *)local_550);
                  peVar15 = ::std::
                            __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)local_540);
                  uVar6 = (*(peVar15->super_bandwidth_socket)._vptr_bandwidth_socket[1])();
                  if ((uVar6 & 1) == 0) {
                    iVar5 = num_connections(this);
                    if (lStack_2e0 <= iVar5) {
                      peVar15 = ::std::
                                __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)local_540);
                      peer_connection::peer_exceeds_limit(peVar15);
                    }
                    sVar16 = ::std::
                             vector<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                             ::size(&this->m_undead_peers);
                    sVar17 = ::std::
                             set<std::shared_ptr<libtorrent::aux::peer_connection>,_std::less<std::shared_ptr<libtorrent::aux::peer_connection>_>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                             ::size(&this->m_connections);
                    ::std::
                    vector<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                    ::reserve(&this->m_undead_peers,sVar16 + 1 + sVar17);
                    ::std::
                    set<std::shared_ptr<libtorrent::aux::peer_connection>,_std::less<std::shared_ptr<libtorrent::aux::peer_connection>_>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                    ::insert(&this->m_connections,(value_type *)local_540);
                    peVar15 = ::std::
                              __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)local_540);
                    (*(peVar15->super_bandwidth_socket)._vptr_bandwidth_socket[5])();
                  }
                  ::std::shared_ptr<libtorrent::aux::peer_connection>::~shared_ptr
                            ((shared_ptr<libtorrent::aux::peer_connection> *)local_540);
                  peer_connection_args::~peer_connection_args
                            ((peer_connection_args *)
                             &c.
                              super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
                }
              }
            }
          }
          else {
            session_log(this,"<== INCOMING CONNECTION [ rejected TCP connection ]");
            bVar2 = alert_manager::should_post<libtorrent::peer_blocked_alert>(&this->m_alerts);
            if (bVar2) {
              stack0xffffffffffffff58 = 0;
              this_00 = (torrent_handle *)((long)&local.impl_.data_ + 0x18);
              torrent_handle::torrent_handle(this_00);
              local.impl_.data_._20_4_ = 5;
              alert_manager::
              emplace_alert<libtorrent::peer_blocked_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::peer_blocked_alert::reason_t>
                        (&this->m_alerts,this_00,(basic_endpoint<boost::asio::ip::tcp> *)local_44,
                         (reason_t *)((long)&local.impl_.data_ + 0x14));
              torrent_handle::~torrent_handle((torrent_handle *)((long)&local.impl_.data_ + 0x18));
            }
          }
        }
        else {
          session_log(this,"<== INCOMING CONNECTION [ rejected uTP connection ]");
          bVar2 = alert_manager::should_post<libtorrent::peer_blocked_alert>(&this->m_alerts);
          if (bVar2) {
            local_78.m_torrent.
            super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            local_78.m_torrent.
            super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            torrent_handle::torrent_handle(&local_78);
            local_7c = utp_disabled;
            alert_manager::
            emplace_alert<libtorrent::peer_blocked_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::peer_blocked_alert::reason_t>
                      (&this->m_alerts,&local_78,(basic_endpoint<boost::asio::ip::tcp> *)local_44,
                       &local_7c);
            torrent_handle::~torrent_handle(&local_78);
          }
        }
      }
    }
    else {
      session_log(this," <== INCOMING CONNECTION [ ignored, paused ]");
    }
  }
  else {
    session_log(this," <== INCOMING CONNECTION [ ignored, aborting ]");
  }
  return;
}

Assistant:

void session_impl::incoming_connection(socket_type s)
	{
		TORRENT_ASSERT(is_single_thread());

		if (m_abort)
		{
#ifndef TORRENT_DISABLE_LOGGING
			session_log(" <== INCOMING CONNECTION [ ignored, aborting ]");
#endif
			return;
		}

		if (m_paused)
		{
#ifndef TORRENT_DISABLE_LOGGING
			session_log(" <== INCOMING CONNECTION [ ignored, paused ]");
#endif
			return;
		}

		error_code ec;
		// we got a connection request!
		tcp::endpoint endp = s.remote_endpoint(ec);

		if (ec)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				session_log(" <== INCOMING CONNECTION [ rejected, could "
					"not retrieve remote endpoint: %s ]"
					, print_error(ec).c_str());
			}
#endif
			return;
		}

		if (!m_settings.get_bool(settings_pack::enable_incoming_utp)
			&& is_utp(s))
		{
#ifndef TORRENT_DISABLE_LOGGING
			session_log("<== INCOMING CONNECTION [ rejected uTP connection ]");
#endif
			if (m_alerts.should_post<peer_blocked_alert>())
				m_alerts.emplace_alert<peer_blocked_alert>(torrent_handle()
					, endp, peer_blocked_alert::utp_disabled);
			return;
		}

		if (!m_settings.get_bool(settings_pack::enable_incoming_tcp)
			&& std::get_if<tcp::socket>(&s))
		{
#ifndef TORRENT_DISABLE_LOGGING
			session_log("<== INCOMING CONNECTION [ rejected TCP connection ]");
#endif
			if (m_alerts.should_post<peer_blocked_alert>())
				m_alerts.emplace_alert<peer_blocked_alert>(torrent_handle()
					, endp, peer_blocked_alert::tcp_disabled);
			return;
		}

		// if there are outgoing interfaces specified, verify this
		// peer is correctly bound to one of them
		if (!m_outgoing_interfaces.empty())
		{
			tcp::endpoint local = s.local_endpoint(ec);
			if (ec)
			{
#ifndef TORRENT_DISABLE_LOGGING
				if (should_log())
				{
					session_log("<== INCOMING CONNECTION [ rejected connection: %s ]"
						, print_error(ec).c_str());
				}
#endif
				return;
			}

			if (!verify_incoming_interface(local.address()))
			{
#ifndef TORRENT_DISABLE_LOGGING
				if (should_log())
				{
					session_log("<== INCOMING CONNECTION [ rejected, local interface has incoming connections disabled: %s ]"
						, local.address().to_string().c_str());
				}
#endif
				if (m_alerts.should_post<peer_blocked_alert>())
					m_alerts.emplace_alert<peer_blocked_alert>(torrent_handle()
						, endp, peer_blocked_alert::invalid_local_interface);
				return;
			}
			if (!verify_bound_address(local.address(), is_utp(s), ec))
			{
				if (ec)
				{
#ifndef TORRENT_DISABLE_LOGGING
					if (should_log())
					{
						session_log("<== INCOMING CONNECTION [ rejected, not allowed local interface: %s ]"
							, print_error(ec).c_str());
					}
#endif
					return;
				}

#ifndef TORRENT_DISABLE_LOGGING
				if (should_log())
				{
					session_log("<== INCOMING CONNECTION [ rejected, not allowed local interface: %s ]"
						, local.address().to_string().c_str());
				}
#endif
				if (m_alerts.should_post<peer_blocked_alert>())
					m_alerts.emplace_alert<peer_blocked_alert>(torrent_handle()
						, endp, peer_blocked_alert::invalid_local_interface);
				return;
			}
		}

		// local addresses do not count, since it's likely
		// coming from our own client through local service discovery
		// and it does not reflect whether or not a router is open
		// for incoming connections or not.
		if (!is_local(endp.address()))
			m_stats_counters.set_value(counters::has_incoming_connections, 1);

		// this filter is ignored if a single torrent
		// is set to ignore the filter, since this peer might be
		// for that torrent
		if (m_stats_counters[counters::non_filter_torrents] == 0
			&& m_ip_filter
			&& (m_ip_filter->access(endp.address()) & ip_filter::blocked))
		{
#ifndef TORRENT_DISABLE_LOGGING
			session_log("<== INCOMING CONNECTION [ filtered blocked ip ]");
#endif
			if (m_alerts.should_post<peer_blocked_alert>())
				m_alerts.emplace_alert<peer_blocked_alert>(torrent_handle()
					, endp, peer_blocked_alert::ip_filter);
			return;
		}

		bool want_on_unknown_torrent = false;
#ifndef TORRENT_DISABLE_EXTENSIONS
		want_on_unknown_torrent = !m_ses_extensions[plugins_unknown_torrent_idx].empty();
#endif

		// check if we have any active torrents
		// or if there is an extension that wants on_unknown_torrent
		// if we don't reject the connection
		if (m_torrents.empty() && !want_on_unknown_torrent)
		{
#ifndef TORRENT_DISABLE_LOGGING
			session_log("<== INCOMING CONNECTION [ rejected, there are no torrents ]");
#endif
			return;
		}

		// figure out which peer classes this is connections has,
		// to get connection_limit_factor
		peer_class_set pcs;
		set_peer_classes(&pcs, endp.address(), socket_type_idx(s));
		int connection_limit_factor = 0;
		for (int i = 0; i < pcs.num_classes(); ++i)
		{
			peer_class_t pc = pcs.class_at(i);
			if (m_classes.at(pc) == nullptr) continue;
			int f = m_classes.at(pc)->connection_limit_factor;
			if (connection_limit_factor < f) connection_limit_factor = f;
		}
		if (connection_limit_factor == 0) connection_limit_factor = 100;

		std::int64_t limit = m_settings.get_int(settings_pack::connections_limit);
		limit = limit * 100 / connection_limit_factor;

		// don't allow more connections than the max setting
		// weighed by the peer class' setting
		bool reject = num_connections() >= limit + m_settings.get_int(settings_pack::connections_slack);

		if (reject)
		{
			if (m_alerts.should_post<peer_disconnected_alert>())
			{
				m_alerts.emplace_alert<peer_disconnected_alert>(torrent_handle(), endp, peer_id()
						, operation_t::bittorrent, socket_type_idx(s)
						, error_code(errors::too_many_connections)
						, close_reason_t::none);
			}
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				session_log("<== INCOMING CONNECTION [ connections limit exceeded, conns: %d, limit: %d, slack: %d ]"
					, num_connections(), m_settings.get_int(settings_pack::connections_limit)
					, m_settings.get_int(settings_pack::connections_slack));
			}
#endif
			return;
		}

		// if we don't have any active torrents, there's no
		// point in accepting this connection. If, however,
		// the setting to start up queued torrents when they
		// get an incoming connection is enabled or if there is
		// an extension that wants on_unknown_torrent, we cannot
		// perform this check.
		if (!m_settings.get_bool(settings_pack::incoming_starts_queued_torrents) && !want_on_unknown_torrent)
		{
			bool has_active_torrent = std::any_of(m_torrents.begin(), m_torrents.end()
				, [](std::shared_ptr<torrent> const& i)
				{ return !i->is_torrent_paused(); });
			if (!has_active_torrent)
			{
#ifndef TORRENT_DISABLE_LOGGING
				session_log("<== INCOMING CONNECTION [ rejected, no active torrents ]");
#endif
				return;
			}
		}

		m_stats_counters.inc_stats_counter(counters::incoming_connections);

		if (m_alerts.should_post<incoming_connection_alert>())
			m_alerts.emplace_alert<incoming_connection_alert>(socket_type_idx(s), endp);

		peer_connection_args pack{
			this
			, &m_settings
			, &m_stats_counters
			, m_disk_thread.get()
			, &m_io_context
			, std::weak_ptr<torrent>()
			, std::move(s)
			, endp
			, nullptr
			, aux::generate_peer_id(m_settings)
		};

		std::shared_ptr<peer_connection> c
			= std::make_shared<bt_peer_connection>(pack);

		if (!c->is_disconnecting())
		{
			// in case we've exceeded the limit, let this peer know that
			// as soon as it's received the handshake, it needs to either
			// disconnect or pick another peer to disconnect
			if (num_connections() >= limit)
				c->peer_exceeds_limit();

			TORRENT_ASSERT(!c->m_in_constructor);
			// removing a peer may not throw an exception, so prepare for this
			// connection to be added to the undead peers now.
			m_undead_peers.reserve(m_undead_peers.size() + m_connections.size() + 1);
			m_connections.insert(c);
			c->start();
		}
	}